

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_quaternion.cpp
# Opt level: O1

void __thiscall ON_Quaternion::SetRotation(ON_Quaternion *this,ON_Plane *plane0,ON_Plane *plane1)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  uint uVar11;
  bool bVar12;
  int iVar13;
  double *pdVar14;
  ulong uVar15;
  ulong uVar16;
  long lVar17;
  double dVar18;
  double dVar19;
  double m [3] [3];
  double local_78 [9];
  
  dVar19 = (plane1->xaxis).x;
  dVar18 = (plane1->yaxis).x;
  dVar1 = (plane0->xaxis).x;
  dVar2 = (plane0->yaxis).x;
  dVar3 = (plane1->zaxis).x;
  dVar4 = (plane0->zaxis).x;
  local_78[0] = dVar3 * dVar4 + dVar19 * dVar1 + dVar18 * dVar2;
  pdVar14 = local_78;
  dVar5 = (plane0->xaxis).y;
  dVar6 = (plane0->yaxis).y;
  dVar7 = (plane0->zaxis).y;
  local_78[1] = dVar3 * dVar7 + dVar19 * dVar5 + dVar18 * dVar6;
  dVar8 = (plane0->xaxis).z;
  dVar9 = (plane0->yaxis).z;
  dVar10 = (plane0->zaxis).z;
  local_78[2] = dVar3 * dVar10 + dVar19 * dVar8 + dVar18 * dVar9;
  dVar19 = (plane1->xaxis).y;
  dVar18 = (plane1->yaxis).y;
  dVar3 = (plane1->zaxis).y;
  local_78[3] = dVar3 * dVar4 + dVar19 * dVar1 + dVar2 * dVar18;
  local_78[4] = dVar3 * dVar7 + dVar19 * dVar5 + dVar6 * dVar18;
  local_78[5] = dVar3 * dVar10 + dVar19 * dVar8 + dVar18 * dVar9;
  dVar19 = (plane1->xaxis).z;
  dVar18 = (plane1->yaxis).z;
  dVar3 = (plane1->zaxis).z;
  local_78[6] = dVar4 * dVar3 + dVar1 * dVar19 + dVar2 * dVar18;
  local_78[7] = dVar7 * dVar3 + dVar5 * dVar19 + dVar6 * dVar18;
  local_78[8] = dVar3 * dVar10 + dVar19 * dVar8 + dVar9 * dVar18;
  uVar15 = 0;
  do {
    uVar16 = 0;
    do {
      if (uVar15 == uVar16) {
        dVar19 = local_78[uVar15 * 4] + -1.0;
      }
      else {
        dVar19 = pdVar14[uVar16];
      }
      if (1.490116119385e-08 < ABS(dVar19)) {
        bVar12 = false;
        goto LAB_0059fbf1;
      }
      uVar16 = uVar16 + 1;
    } while (uVar16 != 3);
    bVar12 = true;
LAB_0059fbf1:
    if (1 < uVar15) break;
    uVar15 = uVar15 + 1;
    pdVar14 = pdVar14 + 3;
  } while (bVar12);
  if (!bVar12) {
    uVar11 = (local_78[4] < local_78[8]) + 1;
    if (local_78[4] <= local_78[0]) {
      uVar11 = (uint)(local_78[0] < local_78[8]) * 2;
    }
    iVar13 = uVar11 + 1;
    if (uVar11 + 1 == 3) {
      iVar13 = 0;
    }
    uVar15 = (ulong)(uVar11 + ((uVar11 + 2) / 3) * -3 + 2);
    uVar16 = (ulong)uVar11;
    lVar17 = (long)iVar13;
    dVar19 = ((local_78[uVar16 * 4] + 1.0) - local_78[lVar17 * 4]) - local_78[uVar15 * 4];
    if (2.2250738585072014e-308 < dVar19) {
      if (dVar19 < 0.0) {
        dVar19 = sqrt(dVar19);
      }
      else {
        dVar19 = SQRT(dVar19);
      }
      dVar18 = 0.5 / dVar19;
      this->a = (local_78[uVar15 * 3 + lVar17] - local_78[lVar17 * 3 + uVar15]) * dVar18;
      (&this->b)[uVar16] = dVar19 * 0.5;
      (&this->b)[lVar17] = (local_78[uVar16 * 3 + lVar17] + local_78[lVar17 * 3 + uVar16]) * dVar18;
      (&this->b)[uVar15] = (local_78[uVar15 * 3 + uVar16] + local_78[uVar16 * 3 + uVar15]) * dVar18;
      return;
    }
    if (dVar19 < -1e-14) {
      ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_quaternion.cpp"
                 ,0xea,"","noisy rotation matrix");
    }
  }
  this->a = 1.0;
  this->b = 0.0;
  this->c = 0.0;
  this->d = 0.0;
  return;
}

Assistant:

void ON_Quaternion::SetRotation(const ON_Plane& plane0, const ON_Plane& plane1 )
{
  double m[3][3], r, s;
  double* q;
  int i,j,k;

  // set m[][] = rotation matrix (acting on the left)
  m[0][0] = plane1.xaxis.x*plane0.xaxis.x
          + plane1.yaxis.x*plane0.yaxis.x
          + plane1.zaxis.x*plane0.zaxis.x;
  m[0][1] = plane1.xaxis.x*plane0.xaxis.y
          + plane1.yaxis.x*plane0.yaxis.y
          + plane1.zaxis.x*plane0.zaxis.y;
  m[0][2] = plane1.xaxis.x*plane0.xaxis.z
          + plane1.yaxis.x*plane0.yaxis.z
          + plane1.zaxis.x*plane0.zaxis.z;
  m[1][0] = plane1.xaxis.y*plane0.xaxis.x
          + plane1.yaxis.y*plane0.yaxis.x
          + plane1.zaxis.y*plane0.zaxis.x;
  m[1][1] = plane1.xaxis.y*plane0.xaxis.y
          + plane1.yaxis.y*plane0.yaxis.y
          + plane1.zaxis.y*plane0.zaxis.y;
  m[1][2] = plane1.xaxis.y*plane0.xaxis.z
          + plane1.yaxis.y*plane0.yaxis.z
          + plane1.zaxis.y*plane0.zaxis.z;
  m[2][0] = plane1.xaxis.z*plane0.xaxis.x
          + plane1.yaxis.z*plane0.yaxis.x
          + plane1.zaxis.z*plane0.zaxis.x;
  m[2][1] = plane1.xaxis.z*plane0.xaxis.y
          + plane1.yaxis.z*plane0.yaxis.y
          + plane1.zaxis.z*plane0.zaxis.y;
  m[2][2] = plane1.xaxis.z*plane0.xaxis.z
          + plane1.yaxis.z*plane0.yaxis.z
          + plane1.zaxis.z*plane0.zaxis.z;

  k = 1;
  s = ON_SQRT_EPSILON;
  for ( i = 0; i < 3 && k; i++ ) for ( j = 0; j < 3; j++ )
  {
    if ( i == j )
    {
      if (fabs(m[i][i]-1.0) > s )
      {
        k = 0;
        break;
      }
    }
    else
    {
      if (fabs(m[i][j]) > s )
      {
        k = 0;
        break;
      }
    }
  }

  if ( k )
  {
    // m[][] is the identity matrix
    a = 1.0;
    b = c = d = 0.0;
    return;
  }

  i = (m[0][0] >= m[1][1]) 
    ? ((m[0][0] >= m[2][2])?0:2) 
    : ((m[1][1] >= m[2][2])?1:2);
  j = (i+1)%3;
  k = (i+2)%3;

  // Note: 
  //   For any rotation matrix, the diagonal is
  //     x^2(1-cos(t)) + cos(t), y^2(1-cos(t)) + cos(t), z^2(1-cos(t)) + cos(t),
  //   where (x,y,z) is the unit vector axis of rotation and "t" is the angle.
  //   So the trace = 1 + 2cos(t).
  //
  //   When cos(t) >= 0, m[i][i] corresponds to the axis component that has
  //   the largest absolute value.
  //
  //   
  //
  //   Observe that 
  //     s = 1 + m[i][i] - m[j][j] - m[k][k]
  //       = 1 + 2*m[i][i] - m[i][i] - m[j][j] - m[k][k]
  //       = 1 + 2*m[i][i] - trace
  //       = 2*(m[i][i] - cos(t))
  //       = 2*(w^2(1-cos(t)^2) + cos(t) - cos(t))
  //       = 2*w*w*(sin(t)^2)
  //
  //    When cos(t) >= 0, m[i][i] corresponds to the coordinate of
  //    the rotation axis with largest absolute value.


  s = 1.0 + m[i][i] - m[j][j] - m[k][k];
  if ( s > ON_DBL_MIN )
  {
    r = sqrt(s);
    s = 0.5/r;
    a = s*(m[k][j] - m[j][k]);
    q = &b;
    q[i] = 0.5*r;
    q[j] = s*(m[i][j] + m[j][i]);
    q[k] = s*(m[k][i] + m[i][k]);
  }
  else
  {
    if ( s < -1.0e-14 )
      ON_ERROR("noisy rotation matrix");
    a = 1.0;
    b = c = d = 0.0;
  }
}